

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O0

pair<std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>,_bool>
 __thiscall
wasm::InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_>::insert
          (InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_> *this,
          pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_> *kv)

{
  iterator __x;
  _List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_> _Var1;
  pointer ppVar2;
  undefined8 extraout_RDX;
  pair<std::__detail::_Node_iterator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>,_false,_false>,_bool>
  pVar3;
  pair<std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>,_bool>
  pVar4;
  _List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_> local_50;
  pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>
  local_48;
  _Node_iterator_base<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>,_false>
  local_38;
  pair<std::__detail::_Node_iterator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>,_false,_false>,_bool>
  inserted;
  pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_> *kv_local;
  InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_> *this_local;
  bool local_10;
  
  inserted._8_8_ = kv;
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>
       ::end(&this->List);
  std::
  pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>
  ::
  pair<std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>,_true>
            (&local_48,&kv->first,&local_50);
  pVar3 = std::
          unordered_map<CFG::Block_*,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>,_std::hash<CFG::Block_*>,_std::equal_to<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>_>_>
          ::insert(&this->Map,&local_48);
  local_38._M_cur =
       (__node_type *)
       pVar3.first.
       super__Node_iterator_base<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>,_false>
       ._M_cur;
  inserted.first.
  super__Node_iterator_base<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>,_false>
  ._M_cur._0_1_ = pVar3.second;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::__cxx11::
    list<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>
    ::push_back(&this->List,(value_type *)inserted._8_8_);
    __x = std::__cxx11::
          list<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>,_std::allocator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>
          ::end(&this->List);
    _Var1 = std::
            prev<std::_List_iterator<std::pair<CFG::Block*const,wasm::InsertOrderedSet<CFG::Block*>>>>
                      (__x._M_node,1);
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>,_false,_false>
                           *)&local_38);
    (ppVar2->second)._M_node = _Var1._M_node;
  }
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>,_false,_false>
           ::operator->((_Node_iterator<std::pair<CFG::Block_*const,_std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_>,_false,_false>
                         *)&local_38);
  std::
  pair<std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>,_bool>
  ::
  pair<std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>_&,_bool_&,_true>
            ((pair<std::_List_iterator<std::pair<CFG::Block_*const,_wasm::InsertOrderedSet<CFG::Block_*>_>_>,_bool>
              *)&this_local,&ppVar2->second,(bool *)&inserted);
  pVar4._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  pVar4.second = local_10;
  pVar4.first._M_node = (_List_node_base *)this_local;
  return pVar4;
}

Assistant:

std::pair<iterator, bool> insert(const std::pair<const Key, T>& kv) {
    // Try inserting with a placeholder list iterator.
    auto inserted = Map.insert({kv.first, List.end()});
    if (inserted.second) {
      // This is a new item; insert it in the list and update the iterator.
      List.push_back(kv);
      inserted.first->second = std::prev(List.end());
    }
    return {inserted.first->second, inserted.second};
  }